

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

Rule * new_rule(Grammar *g,Production *p)

{
  Rule *pRVar1;
  Elem *pEVar2;
  
  pRVar1 = (Rule *)calloc(1,0xa8);
  pRVar1->prod = p;
  pEVar2 = (Elem *)calloc(1,0x20);
  pRVar1->end = pEVar2;
  pEVar2->kind = ELEM_END;
  pEVar2->rule = pRVar1;
  pRVar1->action_index = g->action_index;
  return pRVar1;
}

Assistant:

Rule *new_rule(Grammar *g, Production *p) {
  Rule *r = MALLOC(sizeof(Rule));
  memset(r, 0, sizeof(Rule));
  r->prod = p;
  r->end = new_elem();
  r->end->kind = ELEM_END;
  r->end->rule = r;
  r->action_index = g->action_index;
  return r;
}